

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_ad6874::HandleImportedRuntimeArtifactsMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  _Any_data *p_Var1;
  pointer pcVar2;
  cmInstallCommandArguments *typeArgs;
  cmMakefile *this;
  pointer pbVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  TargetType TVar9;
  uint uVar10;
  int iVar11;
  cmArgumentParser<void> *this_00;
  string *psVar12;
  cmGlobalGenerator *pcVar13;
  cmTarget *this_01;
  undefined8 uVar14;
  cmInstallImportedRuntimeArtifactsGenerator *pcVar15;
  pointer name;
  cmInstallImportedRuntimeArtifactsGenerator *library;
  cmInstallImportedRuntimeArtifactsGenerator *pcVar16;
  cmInstallImportedRuntimeArtifactsGenerator *pcVar17;
  static_string_view name_00;
  static_string_view name_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  string system;
  cmTarget *target;
  Helper helper;
  anon_class_48_1_585e00ec createInstallGenerator;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> targets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  string runtimeDependencySetArg;
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  targetList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  genericArgVector;
  ArgVectors argVectors;
  cmInstallCommandArguments genericArgs;
  cmInstallCommandArguments bundleArgs;
  cmInstallCommandArguments frameworkArgs;
  cmInstallCommandArguments runtimeArgs;
  cmInstallCommandArguments libraryArgs;
  cmInstallRuntimeDependencySet *local_c80;
  undefined1 local_c78 [16];
  undefined1 local_c68 [40];
  undefined1 local_c40 [16];
  undefined1 local_c30 [32];
  undefined1 local_c10 [16];
  cmTarget local_c00 [2];
  _Alloc_hider local_bf0;
  undefined1 local_be8 [8];
  undefined1 local_be0 [16];
  undefined1 local_bd0 [24];
  size_type local_bb8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_bb0;
  _Alloc_hider local_ba0;
  undefined1 local_b98 [32];
  _Alloc_hider local_b78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b08;
  cmTarget **local_ae8;
  cmTarget **local_ae0;
  string local_ad8;
  string local_ab8;
  string local_a98;
  string local_a78;
  string local_a58;
  undefined1 local_a38 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_a00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_9d0;
  ParseResult local_9b8;
  ParseResult local_988;
  ParseResult local_958;
  ParseResult local_928;
  ParseResult local_8f8;
  cmInstallCommandArguments local_8c8;
  cmInstallCommandArguments local_710;
  cmInstallCommandArguments local_558;
  cmInstallCommandArguments local_3a0;
  cmInstallCommandArguments local_1e8;
  
  Helper::Helper((Helper *)local_bd0,status);
  local_b68._M_allocated_capacity = 0;
  local_b68._8_8_ = (cmTarget **)0x0;
  local_b58._M_allocated_capacity = 0;
  if (((anonymous_namespace)::
       HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::argHelper == '\0') &&
     (iVar11 = __cxa_guard_acquire(&(anonymous_namespace)::
                                    HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::argHelper), iVar11 != 0)) {
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword._M_invoker =
         (_Invoker_type)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
    _M_functor._8_8_ = 0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
    _M_manager = (_Manager_type)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue._M_invoker =
         (_Invoker_type)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
    _M_functor._M_unused._M_object = (void *)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
    super__Function_base._M_functor._8_8_ = 0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
    super__Function_base._M_manager = (_Manager_type)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
    super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    name_02.super_string_view._M_str = "LIBRARY";
    name_02.super_string_view._M_len = 7;
    cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
    ::
    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                *)&local_8c8,name_02,0);
    name_03.super_string_view._M_str = "RUNTIME";
    name_03.super_string_view._M_len = 7;
    cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
    ::
    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                *)&local_8c8,name_03,0x18);
    name_04.super_string_view._M_str = "FRAMEWORK";
    name_04.super_string_view._M_len = 9;
    cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
    ::
    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                *)&local_8c8,name_04,0x30);
    name_05.super_string_view._M_str = "BUNDLE";
    name_05.super_string_view._M_len = 6;
    cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
    ::
    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                *)&local_8c8,name_05,0x48);
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&HandleImportedRuntimeArtifactsMode::argHelper,(ActionMap *)&local_8c8);
    ArgumentParser::Base::~Base((Base *)&local_8c8);
    __cxa_atexit(ArgumentParser::Base::~Base,&HandleImportedRuntimeArtifactsMode::argHelper,
                 &__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::argHelper);
  }
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_a38;
  local_a38._0_8_ = (pointer)0x0;
  local_a38._8_8_ = (pointer)0x0;
  local_a38._16_8_ = (pointer)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
  super__Function_base._M_functor._M_unused._0_8_ = (undefined8)(local_a38 + 0x20);
  vStack_9d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_9d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_9e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_9d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_9e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_9e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_a00.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_a00.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_a00.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&HandleImportedRuntimeArtifactsMode::argHelper;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
  super__Function_base._M_functor._8_8_ = 0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
  super__Function_base._M_manager = (_Manager_type)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue._M_invoker =
       (_Invoker_type)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
  _M_functor._M_unused._M_object = (void *)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
  _M_functor._8_8_ = 0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
  _M_manager = (_Manager_type)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword._M_invoker =
       (_Invoker_type)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
                        super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                        .
                        super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ArgumentParser::Instance::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((Instance *)&local_8c8,args,0);
  if (local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword._M_invoker !=
      (_Invoker_type)0x0) {
    p_Var1 = (_Any_data *)
             ((long)&local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.
                     super__Function_base._M_functor + 8);
    (*local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword._M_invoker)
              (p_Var1,p_Var1,__destroy_functor);
  }
  local_b08.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b08.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_b08.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_b28._M_dataplus._M_p = (pointer)&local_b28.field_2;
  local_b28._M_string_length = 0;
  local_b28.field_2._M_local_buf[0] = '\0';
  local_b48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a58._M_dataplus._M_p = (pointer)&local_a58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a58,local_bd0._16_8_,(pointer)(local_bb8 + local_bd0._16_8_));
  cmInstallCommandArguments::cmInstallCommandArguments(&local_8c8,&local_a58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  name_00.super_string_view._M_str = "IMPORTED_RUNTIME_ARTIFACTS";
  name_00.super_string_view._M_len = 0x1a;
  this_00 = cmArgumentParser<void>::
            Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (&local_8c8.super_cmArgumentParser<void>,name_00,
                       (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_b08);
  name_01.super_string_view._M_str = "RUNTIME_DEPENDENCY_SET";
  name_01.super_string_view._M_len = 0x16;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_01,&local_b28);
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_8f8,&local_8c8.super_cmArgumentParser<void>,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a38,&local_b48,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_8f8);
  bVar4 = cmInstallCommandArguments::Finalize(&local_8c8);
  local_a78._M_dataplus._M_p = (pointer)&local_a78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a78,local_bd0._16_8_,(pointer)(local_bb8 + local_bd0._16_8_));
  cmInstallCommandArguments::cmInstallCommandArguments(&local_1e8,&local_a78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._M_dataplus._M_p != &local_a78.field_2) {
    operator_delete(local_a78._M_dataplus._M_p,local_a78.field_2._M_allocated_capacity + 1);
  }
  local_a98._M_dataplus._M_p = (pointer)&local_a98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a98,local_bd0._16_8_,(pointer)(local_bb8 + local_bd0._16_8_));
  cmInstallCommandArguments::cmInstallCommandArguments(&local_3a0,&local_a98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a98._M_dataplus._M_p != &local_a98.field_2) {
    operator_delete(local_a98._M_dataplus._M_p,local_a98.field_2._M_allocated_capacity + 1);
  }
  local_ab8._M_dataplus._M_p = (pointer)&local_ab8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_ab8,local_bd0._16_8_,(pointer)(local_bb8 + local_bd0._16_8_));
  cmInstallCommandArguments::cmInstallCommandArguments(&local_558,&local_ab8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ab8._M_dataplus._M_p != &local_ab8.field_2) {
    operator_delete(local_ab8._M_dataplus._M_p,local_ab8.field_2._M_allocated_capacity + 1);
  }
  local_ad8._M_dataplus._M_p = (pointer)&local_ad8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_ad8,local_bd0._16_8_,(pointer)(local_bb8 + local_bd0._16_8_));
  cmInstallCommandArguments::cmInstallCommandArguments(&local_710,&local_ad8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ad8._M_dataplus._M_p != &local_ad8.field_2) {
    operator_delete(local_ad8._M_dataplus._M_p,local_ad8.field_2._M_allocated_capacity + 1);
  }
  cmArgumentParser<void>::
  Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_928,&local_1e8.super_cmArgumentParser<void>,
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_a38 + 0x20),&local_b48,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_928);
  cmArgumentParser<void>::
  Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_958,&local_3a0.super_cmArgumentParser<void>,
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&vStack_a00,&local_b48,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_958);
  cmArgumentParser<void>::
  Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_988,&local_558.super_cmArgumentParser<void>,
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_9e8,&local_b48,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_988);
  cmArgumentParser<void>::
  Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_9b8,&local_710.super_cmArgumentParser<void>,
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&vStack_9d0,&local_b48,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_9b8);
  if (local_b48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_b48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_710.GenericArguments = &local_8c8;
    local_558.GenericArguments = &local_8c8;
    local_3a0.GenericArguments = &local_8c8;
    local_1e8.GenericArguments = &local_8c8;
    if ((((bVar4) && (bVar4 = cmInstallCommandArguments::Finalize(&local_1e8), bVar4)) &&
        (bVar4 = cmInstallCommandArguments::Finalize(&local_3a0), bVar4)) &&
       ((bVar4 = cmInstallCommandArguments::Finalize(&local_558), bVar4 &&
        (bVar4 = cmInstallCommandArguments::Finalize(&local_710), bVar4)))) {
      if (local_b28._M_string_length == 0) {
        local_c80 = (cmInstallRuntimeDependencySet *)0x0;
      }
      else {
        this = (cmMakefile *)CONCAT44(local_bd0._12_4_,local_bd0._8_4_);
        local_b98._0_8_ = local_b98 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b98,"CMAKE_HOST_SYSTEM_NAME","");
        psVar12 = cmMakefile::GetSafeDefinition(this,(string *)local_b98);
        pcVar2 = (psVar12->_M_dataplus)._M_p;
        local_c40._0_8_ = (cmInstallImportedRuntimeArtifactsGenerator *)local_c30;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_c40,pcVar2,pcVar2 + psVar12->_M_string_length);
        if ((undefined1 *)local_b98._0_8_ != local_b98 + 0x10) {
          operator_delete((void *)local_b98._0_8_,(ulong)(local_b98._16_8_ + 1));
        }
        bVar4 = cmRuntimeDependencyArchive::PlatformSupportsRuntimeDependencies((string *)local_c40)
        ;
        if (bVar4) {
          pcVar13 = cmMakefile::GetGlobalGenerator
                              ((cmMakefile *)CONCAT44(local_bd0._12_4_,local_bd0._8_4_));
          local_c80 = cmGlobalGenerator::GetNamedRuntimeDependencySet(pcVar13,&local_b28);
        }
        else {
          local_b98._0_8_ = (pointer)0x4e;
          local_b98._8_8_ =
               "IMPORTED_RUNTIME_ARTIFACTS RUNTIME_DEPENDENCY_SET is not supported on system \"";
          local_c78._0_8_ = local_c40._8_8_;
          local_c78._8_8_ = local_c40._0_8_;
          local_c68[0x27] = '\"';
          cmStrCat<char>((string *)(local_c30 + 0x20),(cmAlphaNum *)local_b98,
                         (cmAlphaNum *)local_c78,local_c68 + 0x27);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          if ((cmTarget *)local_c10._0_8_ != (cmTarget *)(local_c30 + 0x30)) {
            operator_delete((void *)local_c10._0_8_,
                            (ulong)((long)&((_Alloc_hider *)
                                           local_c00[0].impl._M_t.
                                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                           .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                           _M_head_impl)->_M_p + 1));
          }
          local_c80 = (cmInstallRuntimeDependencySet *)0x0;
        }
        if ((cmInstallImportedRuntimeArtifactsGenerator *)local_c40._0_8_ !=
            (cmInstallImportedRuntimeArtifactsGenerator *)local_c30) {
          operator_delete((void *)local_c40._0_8_,(ulong)(local_c30._0_8_ + 1));
        }
        if (!bVar4) goto LAB_002a0a2e;
      }
      pbVar3 = local_b08.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      name = local_b08.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      if (local_b08.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_b08.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar4 = true;
      }
      else {
        do {
          bVar4 = cmMakefile::IsAlias((cmMakefile *)CONCAT44(local_bd0._12_4_,local_bd0._8_4_),name)
          ;
          if (bVar4) {
            local_b98._0_8_ = (pointer)0x29;
            local_b98._8_8_ = "IMPORTED_RUNTIME_ARTIFACTS given target \"";
            local_c78._8_8_ = (name->_M_dataplus)._M_p;
            local_c78._0_8_ = name->_M_string_length;
            cmStrCat<char[21]>((string *)local_c40,(cmAlphaNum *)local_b98,(cmAlphaNum *)local_c78,
                               (char (*) [21])"\" which is an alias.");
            std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002a0a16:
            pcVar17 = (cmInstallImportedRuntimeArtifactsGenerator *)local_c40._0_8_;
            if ((cmInstallImportedRuntimeArtifactsGenerator *)local_c40._0_8_ !=
                (cmInstallImportedRuntimeArtifactsGenerator *)local_c30) goto LAB_0029fdb2;
            goto LAB_002a0a2e;
          }
          local_c10._0_8_ =
               cmMakefile::FindTargetToUse
                         ((cmMakefile *)CONCAT44(local_bd0._12_4_,local_bd0._8_4_),name,false);
          if (((cmTarget *)local_c10._0_8_ == (cmTarget *)0x0) ||
             (bVar4 = cmTarget::IsImported((cmTarget *)local_c10._0_8_), !bVar4)) {
            pcVar13 = cmMakefile::GetGlobalGenerator
                                ((cmMakefile *)CONCAT44(local_bd0._12_4_,local_bd0._8_4_));
            this_01 = cmGlobalGenerator::FindTarget(pcVar13,name,true);
            if ((this_01 != (cmTarget *)0x0) && (bVar4 = cmTarget::IsImported(this_01), bVar4)) {
              local_c10._0_8_ = this_01;
            }
          }
          if ((cmTarget *)local_c10._0_8_ == (cmTarget *)0x0) {
            local_b98._0_8_ = (pointer)0x29;
            local_b98._8_8_ = "IMPORTED_RUNTIME_ARTIFACTS given target \"";
            local_c78._8_8_ = (name->_M_dataplus)._M_p;
            local_c78._0_8_ = name->_M_string_length;
            cmStrCat<char[24]>((string *)local_c40,(cmAlphaNum *)local_b98,(cmAlphaNum *)local_c78,
                               (char (*) [24])"\" which does not exist.");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_002a0a16;
          }
          TVar9 = cmTarget::GetType((cmTarget *)local_c10._0_8_);
          if (((TVar9 != EXECUTABLE) &&
              (TVar9 = cmTarget::GetType((cmTarget *)local_c10._0_8_), TVar9 != SHARED_LIBRARY)) &&
             (TVar9 = cmTarget::GetType((cmTarget *)local_c10._0_8_), TVar9 != MODULE_LIBRARY)) {
            local_b98._0_8_ = (pointer)0x29;
            local_b98._8_8_ = "IMPORTED_RUNTIME_ARTIFACTS given target \"";
            local_c78._8_8_ = (name->_M_dataplus)._M_p;
            local_c78._0_8_ = name->_M_string_length;
            cmStrCat<char[50]>((string *)local_c40,(cmAlphaNum *)local_b98,(cmAlphaNum *)local_c78,
                               (char (*) [50])"\" which is not an executable, library, or module.");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_002a0a16;
          }
          if (local_b68._8_8_ == local_b58._M_allocated_capacity) {
            std::vector<cmTarget*,std::allocator<cmTarget*>>::_M_realloc_insert<cmTarget*const&>
                      ((vector<cmTarget*,std::allocator<cmTarget*>> *)local_b68._M_local_buf,
                       (iterator)local_b68._8_8_,(cmTarget **)(local_c30 + 0x20));
          }
          else {
            *(undefined8 *)local_b68._8_8_ = local_c10._0_8_;
            local_b68._8_8_ = local_b68._8_8_ + 8;
          }
          name = name + 1;
        } while (name != pbVar3);
        local_b98._4_4_ = local_bd0._4_4_;
        local_b98._0_4_ = local_bd0._0_4_;
        local_b98._12_4_ = local_bd0._12_4_;
        local_b98._8_4_ = local_bd0._8_4_;
        local_b98._16_8_ = &local_b78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_b98 + 0x10),local_bd0._16_8_,
                   (pointer)(local_bb8 + local_bd0._16_8_));
        local_ae8 = (cmTarget **)local_b68._8_8_;
        bVar4 = local_b68._M_allocated_capacity == local_b68._8_8_;
        if (bVar4) {
          bVar7 = false;
          bVar8 = false;
          local_ba0._M_p = (pointer)0x0;
          uVar10 = 0;
        }
        else {
          local_ba0._M_p = (pointer)0x0;
          bVar8 = false;
          bVar7 = false;
          local_c68._32_4_ = 0;
          uVar14 = local_b68._M_allocated_capacity;
          do {
            typeArgs = *(cmInstallCommandArguments **)uVar14;
            local_ae0 = (cmTarget **)uVar14;
            TVar9 = cmTarget::GetType((cmTarget *)typeArgs);
            if (TVar9 == EXECUTABLE) {
              bVar5 = cmTarget::IsAppBundleOnApple((cmTarget *)typeArgs);
              if (!bVar5) {
                (anonymous_namespace)::Helper::GetRuntimeDestination_abi_cxx11_
                          ((string *)local_c78,local_bd0,&local_3a0);
                HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                          ((anon_class_48_1_585e00ec *)local_c40,(cmTarget *)local_b98,typeArgs,
                           (string *)&local_3a0);
                pcVar17 = (cmInstallImportedRuntimeArtifactsGenerator *)local_c40._0_8_;
                local_c40._0_8_ = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                if ((cmInstallImportedRuntimeArtifactsGenerator *)local_c78._0_8_ !=
                    (cmInstallImportedRuntimeArtifactsGenerator *)local_c68) {
                  operator_delete((void *)local_c78._0_8_,local_c68._0_8_ + 1);
                }
                if (local_c80 == (cmInstallRuntimeDependencySet *)0x0) {
LAB_002a0485:
                  library = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  goto LAB_002a0512;
                }
                library = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                pcVar16 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                cmInstallRuntimeDependencySet::AddExecutable(local_c80,pcVar17);
                pcVar15 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                goto LAB_002a0517;
              }
              psVar12 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&local_710);
              if (psVar12->_M_string_length != 0) {
                cmInstallCommandArguments::GetDestination_abi_cxx11_(&local_710);
                HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                          ((anon_class_48_1_585e00ec *)local_c78,(cmTarget *)local_b98,typeArgs,
                           (string *)&local_710);
                pcVar15 = (cmInstallImportedRuntimeArtifactsGenerator *)local_c78._0_8_;
                if (local_c80 == (cmInstallRuntimeDependencySet *)0x0) {
                  library = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  pcVar17 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  pcVar16 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                }
                else {
                  bVar6 = (anonymous_namespace)::
                          AddBundleExecutable<cmInstallImportedRuntimeArtifactsGenerator*>
                                    ((Helper *)local_bd0,local_c80,
                                     (cmInstallImportedRuntimeArtifactsGenerator **)local_c78);
                  bVar5 = false;
                  if (!bVar6) goto LAB_002a0698;
                  pcVar17 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  library = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  pcVar16 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                }
                goto LAB_002a0517;
              }
              local_c78._0_8_ = (cmInstallImportedRuntimeArtifactsGenerator *)0x5c;
              local_c78._8_8_ =
                   "IMPORTED_RUNTIME_ARTIFACTS given no BUNDLE DESTINATION for MACOSX_BUNDLE executable target \""
              ;
              psVar12 = cmTarget::GetName_abi_cxx11_((cmTarget *)typeArgs);
              local_c40._8_8_ = (psVar12->_M_dataplus)._M_p;
              local_c40._0_8_ = psVar12->_M_string_length;
              cmStrCat<char[3]>((string *)(local_c30 + 0x20),(cmAlphaNum *)local_c78,
                                (cmAlphaNum *)local_c40,(char (*) [3])0x6f17e8);
              std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002a07c9:
              if ((cmTarget *)local_c10._0_8_ != (cmTarget *)(local_c30 + 0x30)) {
                operator_delete((void *)local_c10._0_8_,
                                (ulong)((long)&((_Alloc_hider *)
                                               local_c00[0].impl._M_t.
                                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                               .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                               _M_head_impl)->_M_p + 1));
              }
              pcVar15 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
              bVar5 = false;
            }
            else {
              if (TVar9 == SHARED_LIBRARY) {
                bVar5 = cmTarget::IsDLLPlatform((cmTarget *)typeArgs);
                if (bVar5) {
                  (anonymous_namespace)::Helper::GetRuntimeDestination_abi_cxx11_
                            ((string *)local_c78,local_bd0,&local_3a0);
                  HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                            ((anon_class_48_1_585e00ec *)local_c40,(cmTarget *)local_b98,typeArgs,
                             (string *)&local_3a0);
                  pcVar17 = (cmInstallImportedRuntimeArtifactsGenerator *)local_c40._0_8_;
                  local_c40._0_8_ = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  if ((cmInstallImportedRuntimeArtifactsGenerator *)local_c78._0_8_ !=
                      (cmInstallImportedRuntimeArtifactsGenerator *)local_c68) {
                    operator_delete((void *)local_c78._0_8_,local_c68._0_8_ + 1);
                  }
                  if (local_c80 == (cmInstallRuntimeDependencySet *)0x0) goto LAB_002a0485;
                  library = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  pcVar16 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  cmInstallRuntimeDependencySet::AddLibrary(local_c80,pcVar17);
                  pcVar15 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                }
                else {
                  bVar5 = cmTarget::IsFrameworkOnApple((cmTarget *)typeArgs);
                  if (bVar5) {
                    psVar12 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&local_558);
                    if (psVar12->_M_string_length == 0) {
                      local_c78._0_8_ = &DAT_0000005f;
                      local_c78._8_8_ =
                           "IMPORTED_RUNTIME_ARTIFACTS given no FRAMEWORK DESTINATION for shared library FRAMEWORK target \""
                      ;
                      psVar12 = cmTarget::GetName_abi_cxx11_((cmTarget *)typeArgs);
                      local_c40._8_8_ = (psVar12->_M_dataplus)._M_p;
                      local_c40._0_8_ = psVar12->_M_string_length;
                      cmStrCat<char[3]>((string *)(local_c30 + 0x20),(cmAlphaNum *)local_c78,
                                        (cmAlphaNum *)local_c40,(char (*) [3])0x6f17e8);
                      std::__cxx11::string::_M_assign((string *)&status->Error);
                      goto LAB_002a07c9;
                    }
                    cmInstallCommandArguments::GetDestination_abi_cxx11_(&local_558);
                    HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                              ((anon_class_48_1_585e00ec *)local_c78,(cmTarget *)local_b98,typeArgs,
                               (string *)&local_558);
                    pcVar16 = (cmInstallImportedRuntimeArtifactsGenerator *)local_c78._0_8_;
                    if (local_c80 == (cmInstallRuntimeDependencySet *)0x0) {
                      library = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                      pcVar17 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                      goto LAB_002a0515;
                    }
                    library = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                    pcVar17 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                    cmInstallRuntimeDependencySet::AddLibrary
                              (local_c80,
                               (cmInstallImportedRuntimeArtifactsGenerator *)local_c78._0_8_);
                    pcVar15 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  }
                  else {
                    (anonymous_namespace)::Helper::GetLibraryDestination_abi_cxx11_
                              ((string *)local_c78,local_bd0,&local_1e8);
                    HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                              ((anon_class_48_1_585e00ec *)local_c40,(cmTarget *)local_b98,typeArgs,
                               (string *)&local_1e8);
                    library = (cmInstallImportedRuntimeArtifactsGenerator *)local_c40._0_8_;
                    local_c40._0_8_ = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                    if ((cmInstallImportedRuntimeArtifactsGenerator *)local_c78._0_8_ !=
                        (cmInstallImportedRuntimeArtifactsGenerator *)local_c68) {
                      operator_delete((void *)local_c78._0_8_,local_c68._0_8_ + 1);
                    }
                    if (local_c80 == (cmInstallRuntimeDependencySet *)0x0) goto LAB_002a050f;
                    pcVar17 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                    pcVar16 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                    cmInstallRuntimeDependencySet::AddLibrary(local_c80,library);
                    pcVar15 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  }
                }
              }
              else {
                if (TVar9 != MODULE_LIBRARY) {
                  __assert_fail("false && \"This should never happen\"",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallCommand.cxx"
                                ,0x5bc,
                                "bool (anonymous namespace)::HandleImportedRuntimeArtifactsMode(const std::vector<std::string> &, cmExecutionStatus &)"
                               );
                }
                (anonymous_namespace)::Helper::GetLibraryDestination_abi_cxx11_
                          ((string *)local_c78,local_bd0,&local_1e8);
                HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                          ((anon_class_48_1_585e00ec *)local_c40,(cmTarget *)local_b98,typeArgs,
                           (string *)&local_1e8);
                library = (cmInstallImportedRuntimeArtifactsGenerator *)local_c40._0_8_;
                local_c40._0_8_ = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                if ((cmInstallImportedRuntimeArtifactsGenerator *)local_c78._0_8_ !=
                    (cmInstallImportedRuntimeArtifactsGenerator *)local_c68) {
                  operator_delete((void *)local_c78._0_8_,local_c68._0_8_ + 1);
                }
                if (local_c80 == (cmInstallRuntimeDependencySet *)0x0) {
LAB_002a050f:
                  pcVar17 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
LAB_002a0512:
                  pcVar16 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
LAB_002a0515:
                  pcVar15 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                }
                else {
                  pcVar17 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  pcVar16 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  cmInstallRuntimeDependencySet::AddModule(local_c80,library);
                  pcVar15 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                }
              }
LAB_002a0517:
              local_be0._8_8_ = library;
              cmMakefile::AddInstallGenerator
                        ((cmMakefile *)CONCAT44(local_bd0._12_4_,local_bd0._8_4_),
                         (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *
                         )(local_be0 + 8));
              if ((cmInstallImportedRuntimeArtifactsGenerator *)local_be0._8_8_ !=
                  (cmInstallImportedRuntimeArtifactsGenerator *)0x0) {
                (**(code **)(*(long *)local_be0._8_8_ + 8))();
              }
              local_be0._8_8_ = (pointer)0x0;
              local_be0._0_8_ = pcVar17;
              cmMakefile::AddInstallGenerator
                        ((cmMakefile *)CONCAT44(local_bd0._12_4_,local_bd0._8_4_),
                         (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *
                         )local_be0);
              if ((cmInstallImportedRuntimeArtifactsGenerator *)local_be0._0_8_ !=
                  (cmInstallImportedRuntimeArtifactsGenerator *)0x0) {
                (**(code **)(*(long *)local_be0._0_8_ + 8))();
              }
              local_be0._0_8_ = 0;
              local_be8 = (undefined1  [8])pcVar16;
              cmMakefile::AddInstallGenerator
                        ((cmMakefile *)CONCAT44(local_bd0._12_4_,local_bd0._8_4_),
                         (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *
                         )local_be8);
              if (local_be8 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)local_be8 + 8))();
              }
              local_be8 = (undefined1  [8])0x0;
              local_bf0._M_p = (pointer)pcVar15;
              cmMakefile::AddInstallGenerator
                        ((cmMakefile *)CONCAT44(local_bd0._12_4_,local_bd0._8_4_),
                         (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *
                         )&local_bf0);
              if ((cmInstallImportedRuntimeArtifactsGenerator *)local_bf0._M_p !=
                  (cmInstallImportedRuntimeArtifactsGenerator *)0x0) {
                (**(code **)(*(long *)local_bf0._M_p + 8))();
              }
              local_c68._32_4_ =
                   CONCAT31(SUB43(local_c68._32_4_,1),
                            (byte)local_c68._32_4_ |
                            library != (cmInstallImportedRuntimeArtifactsGenerator *)0x0) &
                   0xffffff01;
              bVar7 = (bool)(bVar7 | pcVar17 != (cmInstallImportedRuntimeArtifactsGenerator *)0x0);
              bVar8 = (bool)(bVar8 | pcVar16 != (cmInstallImportedRuntimeArtifactsGenerator *)0x0);
              local_ba0._M_p =
                   (pointer)(CONCAT71((int7)((ulong)local_ba0._M_p >> 8),
                                      (byte)local_ba0._M_p |
                                      pcVar15 != (cmInstallImportedRuntimeArtifactsGenerator *)0x0)
                            & 0xffffffffffffff01);
              local_bf0._M_p = (pointer)0x0;
              bVar5 = true;
              pcVar15 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
            }
LAB_002a0698:
            if (pcVar15 != (cmInstallImportedRuntimeArtifactsGenerator *)0x0) {
              (*(pcVar15->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator
                [1])();
            }
            uVar10 = local_c68._32_4_;
            if (!bVar5) break;
            uVar14 = local_ae0 + 1;
            bVar4 = (cmTarget **)uVar14 == local_ae8;
          } while (!bVar4);
        }
        if (bVar4) {
          if ((uVar10 & 1) != 0) {
            pcVar13 = cmMakefile::GetGlobalGenerator
                                ((cmMakefile *)CONCAT44(local_bd0._12_4_,local_bd0._8_4_));
            psVar12 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&local_1e8);
            cmGlobalGenerator::AddInstallComponent(pcVar13,psVar12);
          }
          if (bVar7) {
            pcVar13 = cmMakefile::GetGlobalGenerator
                                ((cmMakefile *)CONCAT44(local_bd0._12_4_,local_bd0._8_4_));
            psVar12 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&local_3a0);
            cmGlobalGenerator::AddInstallComponent(pcVar13,psVar12);
          }
          if (bVar8) {
            pcVar13 = cmMakefile::GetGlobalGenerator
                                ((cmMakefile *)CONCAT44(local_bd0._12_4_,local_bd0._8_4_));
            psVar12 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&local_558);
            cmGlobalGenerator::AddInstallComponent(pcVar13,psVar12);
          }
          if (((ulong)local_ba0._M_p & 1) != 0) {
            pcVar13 = cmMakefile::GetGlobalGenerator
                                ((cmMakefile *)CONCAT44(local_bd0._12_4_,local_bd0._8_4_));
            psVar12 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&local_710);
            cmGlobalGenerator::AddInstallComponent(pcVar13,psVar12);
          }
        }
        if ((_Alloc_hider *)local_b98._16_8_ != &local_b78) {
          operator_delete((void *)local_b98._16_8_,(ulong)(local_b78._M_p + 1));
        }
      }
      goto LAB_002a0a30;
    }
  }
  else {
    local_b98._24_8_ =
         ((local_b48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_b98._16_8_ =
         (local_b48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    local_b98._0_8_ = (pointer)0x33;
    local_b98._8_8_ = "IMPORTED_RUNTIME_ARTIFACTS given unknown argument \"";
    local_b78._M_p = &DAT_00000002;
    local_b70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6f17e8;
    views._M_len = 3;
    views._M_array = (iterator)local_b98;
    cmCatViews_abi_cxx11_((string *)local_c78,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_c30._0_8_ = local_c68._0_8_;
    pcVar17 = (cmInstallImportedRuntimeArtifactsGenerator *)local_c78._0_8_;
    if ((cmInstallImportedRuntimeArtifactsGenerator *)local_c78._0_8_ !=
        (cmInstallImportedRuntimeArtifactsGenerator *)local_c68) {
LAB_0029fdb2:
      operator_delete(pcVar17,(ulong)((long)&(((pointer)local_c30._0_8_)->_M_dataplus)._M_p + 1));
    }
  }
LAB_002a0a2e:
  bVar4 = false;
LAB_002a0a30:
  cmInstallCommandArguments::~cmInstallCommandArguments(&local_710);
  cmInstallCommandArguments::~cmInstallCommandArguments(&local_558);
  cmInstallCommandArguments::~cmInstallCommandArguments(&local_3a0);
  cmInstallCommandArguments::~cmInstallCommandArguments(&local_1e8);
  cmInstallCommandArguments::~cmInstallCommandArguments(&local_8c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b28._M_dataplus._M_p != &local_b28.field_2) {
    operator_delete(local_b28._M_dataplus._M_p,
                    CONCAT71(local_b28.field_2._M_allocated_capacity._1_7_,
                             local_b28.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b08);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_9d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_9e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_a00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_a38 + 0x20));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a38);
  if ((cmTarget **)local_b68._M_allocated_capacity != (cmTarget **)0x0) {
    operator_delete((void *)local_b68._M_allocated_capacity,
                    local_b58._M_allocated_capacity - local_b68._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bd0._16_8_ != &local_bb0) {
    operator_delete((void *)local_bd0._16_8_,local_bb0._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool HandleImportedRuntimeArtifactsMode(std::vector<std::string> const& args,
                                        cmExecutionStatus& status)
{
  Helper helper(status);

  // This is the IMPORTED_RUNTIME_ARTIFACTS mode.
  std::vector<cmTarget*> targets;

  struct ArgVectors
  {
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Library;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Runtime;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Framework;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Bundle;
  };

  static auto const argHelper = cmArgumentParser<ArgVectors>{}
                                  .Bind("LIBRARY"_s, &ArgVectors::Library)
                                  .Bind("RUNTIME"_s, &ArgVectors::Runtime)
                                  .Bind("FRAMEWORK"_s, &ArgVectors::Framework)
                                  .Bind("BUNDLE"_s, &ArgVectors::Bundle);

  std::vector<std::string> genericArgVector;
  ArgVectors const argVectors = argHelper.Parse(args, &genericArgVector);

  // now parse the generic args (i.e. the ones not specialized on LIBRARY,
  // RUNTIME etc. (see above)
  ArgumentParser::MaybeEmpty<std::vector<std::string>> targetList;
  std::string runtimeDependencySetArg;
  std::vector<std::string> unknownArgs;
  cmInstallCommandArguments genericArgs(helper.DefaultComponentName);
  genericArgs.Bind("IMPORTED_RUNTIME_ARTIFACTS"_s, targetList)
    .Bind("RUNTIME_DEPENDENCY_SET"_s, runtimeDependencySetArg);
  genericArgs.Parse(genericArgVector, &unknownArgs);
  bool success = genericArgs.Finalize();

  cmInstallCommandArguments libraryArgs(helper.DefaultComponentName);
  cmInstallCommandArguments runtimeArgs(helper.DefaultComponentName);
  cmInstallCommandArguments frameworkArgs(helper.DefaultComponentName);
  cmInstallCommandArguments bundleArgs(helper.DefaultComponentName);

  // now parse the args for specific parts of the target (e.g. LIBRARY,
  // RUNTIME etc.
  libraryArgs.Parse(argVectors.Library, &unknownArgs);
  runtimeArgs.Parse(argVectors.Runtime, &unknownArgs);
  frameworkArgs.Parse(argVectors.Framework, &unknownArgs);
  bundleArgs.Parse(argVectors.Bundle, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    status.SetError(
      cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given unknown argument \"",
               unknownArgs[0], "\"."));
    return false;
  }

  // apply generic args
  libraryArgs.SetGenericArguments(&genericArgs);
  runtimeArgs.SetGenericArguments(&genericArgs);
  frameworkArgs.SetGenericArguments(&genericArgs);
  bundleArgs.SetGenericArguments(&genericArgs);

  success = success && libraryArgs.Finalize();
  success = success && runtimeArgs.Finalize();
  success = success && frameworkArgs.Finalize();
  success = success && bundleArgs.Finalize();

  if (!success) {
    return false;
  }

  cmInstallRuntimeDependencySet* runtimeDependencySet = nullptr;
  if (!runtimeDependencySetArg.empty()) {
    auto system = helper.Makefile->GetSafeDefinition("CMAKE_HOST_SYSTEM_NAME");
    if (!cmRuntimeDependencyArchive::PlatformSupportsRuntimeDependencies(
          system)) {
      status.SetError(
        cmStrCat("IMPORTED_RUNTIME_ARTIFACTS RUNTIME_DEPENDENCY_SET is not "
                 "supported on system \"",
                 system, '"'));
      return false;
    }
    runtimeDependencySet =
      helper.Makefile->GetGlobalGenerator()->GetNamedRuntimeDependencySet(
        runtimeDependencySetArg);
  }

  // Check if there is something to do.
  if (targetList.empty()) {
    return true;
  }

  for (std::string const& tgt : targetList) {
    if (helper.Makefile->IsAlias(tgt)) {
      status.SetError(cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given target \"",
                               tgt, "\" which is an alias."));
      return false;
    }
    // Lookup this target in the current directory.
    cmTarget* target = helper.Makefile->FindTargetToUse(tgt);
    if (!target || !target->IsImported()) {
      // If no local target has been found, find it in the global scope.
      cmTarget* const global_target =
        helper.Makefile->GetGlobalGenerator()->FindTarget(tgt, true);
      if (global_target && global_target->IsImported()) {
        target = global_target;
      }
    }
    if (target) {
      // Found the target.  Check its type.
      if (target->GetType() != cmStateEnums::EXECUTABLE &&
          target->GetType() != cmStateEnums::SHARED_LIBRARY &&
          target->GetType() != cmStateEnums::MODULE_LIBRARY) {
        status.SetError(
          cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given target \"", tgt,
                   "\" which is not an executable, library, or module."));
        return false;
      }
      // Store the target in the list to be installed.
      targets.push_back(target);
    } else {
      // Did not find the target.
      status.SetError(cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given target \"",
                               tgt, "\" which does not exist."));
      return false;
    }
  }

  // Keep track of whether we will be performing an installation of
  // any files of the given type.
  bool installsLibrary = false;
  bool installsRuntime = false;
  bool installsFramework = false;
  bool installsBundle = false;

  auto const createInstallGenerator =
    [helper](cmTarget& target, const cmInstallCommandArguments& typeArgs,
             const std::string& destination)
    -> std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator> {
    return cm::make_unique<cmInstallImportedRuntimeArtifactsGenerator>(
      target.GetName(), destination, typeArgs.GetPermissions(),
      typeArgs.GetConfigurations(), typeArgs.GetComponent(),
      cmInstallGenerator::SelectMessageLevel(helper.Makefile),
      typeArgs.GetExcludeFromAll(), typeArgs.GetOptional(),
      helper.Makefile->GetBacktrace());
  };

  // Generate install script code to install the given targets.
  for (cmTarget* ti : targets) {
    // Handle each target type.
    cmTarget& target = *ti;
    std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator>
      libraryGenerator;
    std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator>
      runtimeGenerator;
    std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator>
      frameworkGenerator;
    std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator>
      bundleGenerator;

    switch (target.GetType()) {
      case cmStateEnums::SHARED_LIBRARY:
        if (target.IsDLLPlatform()) {
          runtimeGenerator = createInstallGenerator(
            target, runtimeArgs, helper.GetRuntimeDestination(&runtimeArgs));
          if (runtimeDependencySet) {
            runtimeDependencySet->AddLibrary(runtimeGenerator.get());
          }
        } else if (target.IsFrameworkOnApple()) {
          if (frameworkArgs.GetDestination().empty()) {
            status.SetError(cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given no "
                                     "FRAMEWORK DESTINATION for shared "
                                     "library FRAMEWORK target \"",
                                     target.GetName(), "\"."));
            return false;
          }
          frameworkGenerator = createInstallGenerator(
            target, frameworkArgs, frameworkArgs.GetDestination());
          if (runtimeDependencySet) {
            runtimeDependencySet->AddLibrary(frameworkGenerator.get());
          }
        } else {
          libraryGenerator = createInstallGenerator(
            target, libraryArgs, helper.GetLibraryDestination(&libraryArgs));
          if (runtimeDependencySet) {
            runtimeDependencySet->AddLibrary(libraryGenerator.get());
          }
        }
        break;
      case cmStateEnums::MODULE_LIBRARY:
        libraryGenerator = createInstallGenerator(
          target, libraryArgs, helper.GetLibraryDestination(&libraryArgs));
        if (runtimeDependencySet) {
          runtimeDependencySet->AddModule(libraryGenerator.get());
        }
        break;
      case cmStateEnums::EXECUTABLE:
        if (target.IsAppBundleOnApple()) {
          if (bundleArgs.GetDestination().empty()) {
            status.SetError(
              cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given no BUNDLE "
                       "DESTINATION for MACOSX_BUNDLE executable target \"",
                       target.GetName(), "\"."));
            return false;
          }
          bundleGenerator = createInstallGenerator(
            target, bundleArgs, bundleArgs.GetDestination());
          if (runtimeDependencySet) {
            if (!AddBundleExecutable(helper, runtimeDependencySet,
                                     bundleGenerator.get())) {
              return false;
            }
          }
        } else {
          runtimeGenerator = createInstallGenerator(
            target, runtimeArgs, helper.GetRuntimeDestination(&runtimeArgs));
          if (runtimeDependencySet) {
            runtimeDependencySet->AddExecutable(runtimeGenerator.get());
          }
        }
        break;
      default:
        assert(false && "This should never happen");
        break;
    }

    // Keep track of whether we're installing anything in each category
    installsLibrary = installsLibrary || libraryGenerator;
    installsRuntime = installsRuntime || runtimeGenerator;
    installsFramework = installsFramework || frameworkGenerator;
    installsBundle = installsBundle || bundleGenerator;

    helper.Makefile->AddInstallGenerator(std::move(libraryGenerator));
    helper.Makefile->AddInstallGenerator(std::move(runtimeGenerator));
    helper.Makefile->AddInstallGenerator(std::move(frameworkGenerator));
    helper.Makefile->AddInstallGenerator(std::move(bundleGenerator));
  }

  // Tell the global generator about any installation component names
  // specified
  if (installsLibrary) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      libraryArgs.GetComponent());
  }
  if (installsRuntime) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      runtimeArgs.GetComponent());
  }
  if (installsFramework) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      frameworkArgs.GetComponent());
  }
  if (installsBundle) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      bundleArgs.GetComponent());
  }

  return true;
}